

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniserver.c
# Opt level: O0

void InitMiniServerSockArray(MiniServerSockArray *miniSocket)

{
  MiniServerSockArray *miniSocket_local;
  
  miniSocket->miniServerSock4 = -1;
  miniSocket->miniServerSock6 = -1;
  miniSocket->miniServerSock6UlaGua = -1;
  miniSocket->miniServerStopSock = -1;
  miniSocket->ssdpSock4 = -1;
  miniSocket->ssdpSock6 = -1;
  miniSocket->ssdpSock6UlaGua = -1;
  miniSocket->stopPort = 0;
  miniSocket->miniServerPort4 = 0;
  miniSocket->miniServerPort6 = 0;
  miniSocket->miniServerPort6UlaGua = 0;
  miniSocket->ssdpReqSock4 = -1;
  miniSocket->ssdpReqSock6 = -1;
  return;
}

Assistant:

static UPNP_INLINE void InitMiniServerSockArray(MiniServerSockArray *miniSocket)
{
	miniSocket->miniServerSock4 = INVALID_SOCKET;
	miniSocket->miniServerSock6 = INVALID_SOCKET;
	miniSocket->miniServerSock6UlaGua = INVALID_SOCKET;
	miniSocket->miniServerStopSock = INVALID_SOCKET;
	miniSocket->ssdpSock4 = INVALID_SOCKET;
	miniSocket->ssdpSock6 = INVALID_SOCKET;
	miniSocket->ssdpSock6UlaGua = INVALID_SOCKET;
	miniSocket->stopPort = 0u;
	miniSocket->miniServerPort4 = 0u;
	miniSocket->miniServerPort6 = 0u;
	miniSocket->miniServerPort6UlaGua = 0u;
	#ifdef INCLUDE_CLIENT_APIS
	miniSocket->ssdpReqSock4 = INVALID_SOCKET;
	miniSocket->ssdpReqSock6 = INVALID_SOCKET;
	#endif /* INCLUDE_CLIENT_APIS */
}